

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::replace_illegal_names(CompilerHLSL *this)

{
  int iVar1;
  long lVar2;
  undefined1 local_fc3;
  undefined1 local_fc2;
  undefined1 local_fc1;
  undefined1 *local_fc0 [2];
  undefined1 local_fb0 [16];
  undefined1 *local_fa0 [2];
  undefined1 local_f90 [16];
  undefined1 *local_f80 [2];
  undefined1 local_f70 [16];
  undefined1 *local_f60 [2];
  undefined1 local_f50 [16];
  undefined1 *local_f40 [2];
  undefined1 local_f30 [16];
  undefined1 *local_f20 [2];
  undefined1 local_f10 [16];
  undefined1 *local_f00 [2];
  undefined1 local_ef0 [16];
  undefined1 *local_ee0 [2];
  undefined1 local_ed0 [16];
  undefined1 *local_ec0 [2];
  undefined1 local_eb0 [16];
  undefined1 *local_ea0 [2];
  undefined1 local_e90 [16];
  undefined1 *local_e80 [2];
  undefined1 local_e70 [16];
  undefined1 *local_e60 [2];
  undefined1 local_e50 [16];
  undefined1 *local_e40 [2];
  undefined1 local_e30 [16];
  undefined1 *local_e20 [2];
  undefined1 local_e10 [16];
  undefined1 *local_e00 [2];
  undefined1 local_df0 [16];
  undefined1 *local_de0 [2];
  undefined1 local_dd0 [16];
  undefined1 *local_dc0 [2];
  undefined1 local_db0 [16];
  undefined1 *local_da0 [2];
  undefined1 local_d90 [16];
  undefined1 *local_d80 [2];
  undefined1 local_d70 [16];
  undefined1 *local_d60 [2];
  undefined1 local_d50 [16];
  undefined1 *local_d40 [2];
  undefined1 local_d30 [16];
  undefined1 *local_d20 [2];
  undefined1 local_d10 [16];
  undefined1 *local_d00 [2];
  undefined1 local_cf0 [16];
  undefined1 *local_ce0 [2];
  undefined1 local_cd0 [16];
  undefined1 *local_cc0 [2];
  undefined1 local_cb0 [16];
  undefined1 *local_ca0 [2];
  undefined1 local_c90 [16];
  undefined1 *local_c80 [2];
  undefined1 local_c70 [16];
  undefined1 *local_c60 [2];
  undefined1 local_c50 [16];
  undefined1 *local_c40 [2];
  undefined1 local_c30 [16];
  undefined1 *local_c20 [2];
  undefined1 local_c10 [16];
  undefined1 *local_c00 [2];
  undefined1 local_bf0 [16];
  undefined1 *local_be0 [2];
  undefined1 local_bd0 [16];
  undefined1 *local_bc0 [2];
  undefined1 local_bb0 [16];
  undefined1 *local_ba0 [2];
  undefined1 local_b90 [16];
  undefined1 *local_b80 [2];
  undefined1 local_b70 [16];
  undefined1 *local_b60 [2];
  undefined1 local_b50 [16];
  undefined1 *local_b40 [2];
  undefined1 local_b30 [16];
  undefined1 *local_b20 [2];
  undefined1 local_b10 [16];
  undefined1 *local_b00 [2];
  undefined1 local_af0 [16];
  undefined1 *local_ae0 [2];
  undefined1 local_ad0 [16];
  undefined1 *local_ac0 [2];
  undefined1 local_ab0 [16];
  undefined1 *local_aa0 [2];
  undefined1 local_a90 [16];
  undefined1 *local_a80 [2];
  undefined1 local_a70 [16];
  undefined1 *local_a60 [2];
  undefined1 local_a50 [16];
  undefined1 *local_a40 [2];
  undefined1 local_a30 [16];
  undefined1 *local_a20 [2];
  undefined1 local_a10 [16];
  undefined1 *local_a00 [2];
  undefined1 local_9f0 [16];
  undefined1 *local_9e0 [2];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0 [2];
  undefined1 local_9b0 [16];
  undefined1 *local_9a0 [2];
  undefined1 local_990 [16];
  undefined1 *local_980 [2];
  undefined1 local_970 [16];
  undefined1 *local_960 [2];
  undefined1 local_950 [16];
  undefined1 *local_940 [2];
  undefined1 local_930 [16];
  undefined1 *local_920 [2];
  undefined1 local_910 [16];
  undefined1 *local_900 [2];
  undefined1 local_8f0 [16];
  undefined1 *local_8e0 [2];
  undefined1 local_8d0 [16];
  undefined1 *local_8c0 [2];
  undefined1 local_8b0 [16];
  undefined1 *local_8a0 [2];
  undefined1 local_890 [16];
  undefined1 *local_880 [2];
  undefined1 local_870 [16];
  undefined1 *local_860 [2];
  undefined1 local_850 [16];
  undefined1 *local_840 [2];
  undefined1 local_830 [16];
  undefined1 *local_820 [2];
  undefined1 local_810 [16];
  undefined1 *local_800 [2];
  undefined1 local_7f0 [16];
  undefined1 *local_7e0 [2];
  undefined1 local_7d0 [16];
  undefined1 *local_7c0 [2];
  undefined1 local_7b0 [16];
  undefined1 *local_7a0 [2];
  undefined1 local_790 [16];
  undefined1 *local_780 [2];
  undefined1 local_770 [16];
  undefined1 *local_760 [2];
  undefined1 local_750 [16];
  undefined1 *local_740 [2];
  undefined1 local_730 [16];
  undefined1 *local_720 [2];
  undefined1 local_710 [16];
  undefined1 *local_700 [2];
  undefined1 local_6f0 [16];
  undefined1 *local_6e0 [2];
  undefined1 local_6d0 [16];
  undefined1 *local_6c0 [2];
  undefined1 local_6b0 [16];
  undefined1 *local_6a0 [2];
  undefined1 local_690 [16];
  undefined1 *local_680 [2];
  undefined1 local_670 [16];
  undefined1 *local_660 [2];
  undefined1 local_650 [16];
  undefined1 *local_640 [2];
  undefined1 local_630 [16];
  undefined1 *local_620 [2];
  undefined1 local_610 [16];
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  undefined1 *local_5e0 [2];
  undefined1 local_5d0 [16];
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 *local_580 [2];
  undefined1 local_570 [16];
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined1 *local_500 [2];
  undefined1 local_4f0 [16];
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined1 *local_4c0 [2];
  undefined1 local_4b0 [16];
  undefined1 *local_4a0 [2];
  undefined1 local_490 [16];
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined1 *local_460 [2];
  undefined1 local_450 [16];
  undefined1 *local_440 [2];
  undefined1 local_430 [16];
  undefined1 *local_420 [2];
  undefined1 local_410 [16];
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined1 *local_320 [2];
  undefined1 local_310 [16];
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  undefined1 *local_2e0 [2];
  undefined1 local_2d0 [16];
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (replace_illegal_names()::keywords_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&replace_illegal_names()::keywords_abi_cxx11_);
    if (iVar1 != 0) {
      local_fc0[0] = local_fb0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_fc0,"AppendStructuredBuffer","");
      local_fa0[0] = local_f90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fa0,"asm","");
      local_f80[0] = local_f70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f80,"asm_fragment","");
      local_f60[0] = local_f50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f60,"BlendState","");
      local_f40[0] = local_f30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f40,"bool","");
      local_f20[0] = local_f10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f20,"break","");
      local_f00[0] = local_ef0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"Buffer","");
      local_ee0[0] = local_ed0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ee0,"ByteAddressBuffer","");
      local_ec0[0] = local_eb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ec0,"case","");
      local_ea0[0] = local_e90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ea0,"cbuffer","");
      local_e80[0] = local_e70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e80,"centroid","");
      local_e60[0] = local_e50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e60,"class","");
      local_e40[0] = local_e30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e40,"column_major","");
      local_e20[0] = local_e10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e20,"compile","");
      local_e00[0] = local_df0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e00,"compile_fragment","");
      local_de0[0] = local_dd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_de0,"CompileShader","");
      local_dc0[0] = local_db0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_dc0,"const","");
      local_da0[0] = local_d90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_da0,"continue","");
      local_d80[0] = local_d70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d80,"ComputeShader","");
      local_d60[0] = local_d50;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d60,"ConsumeStructuredBuffer","");
      local_d40[0] = local_d30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d40,"default","");
      local_d20[0] = local_d10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d20,"DepthStencilState","");
      local_d00[0] = local_cf0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d00,"DepthStencilView","");
      local_ce0[0] = local_cd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ce0,"discard","");
      local_cc0[0] = local_cb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_cc0,"do","");
      local_ca0[0] = local_c90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ca0,"double","");
      local_c80[0] = local_c70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c80,"DomainShader","");
      local_c60[0] = local_c50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c60,"dword","");
      local_c40[0] = local_c30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c40,"else","");
      local_c20[0] = local_c10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c20,"export","");
      local_c00[0] = local_bf0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c00,"false","");
      local_be0[0] = local_bd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_be0,"float","");
      local_bc0[0] = local_bb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_bc0,"for","");
      local_ba0[0] = local_b90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ba0,"fxgroup","");
      local_b80[0] = local_b70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b80,"GeometryShader","");
      local_b60[0] = local_b50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b60,"groupshared","");
      local_b40[0] = local_b30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b40,"half","");
      local_b20[0] = local_b10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b20,"HullShader","");
      local_b00[0] = local_af0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b00,"indices","");
      local_ae0[0] = local_ad0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"if","");
      local_ac0[0] = local_ab0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"in","");
      local_aa0[0] = local_a90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_aa0,"inline","");
      local_a80[0] = local_a70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a80,"inout","");
      local_a60[0] = local_a50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a60,"InputPatch","");
      local_a40[0] = local_a30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a40,"int","");
      local_a20[0] = local_a10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a20,"interface","");
      local_a00[0] = local_9f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,"line","");
      local_9e0[0] = local_9d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9e0,"lineadj","");
      local_9c0[0] = local_9b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9c0,"linear","");
      local_9a0[0] = local_990;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"LineStream","");
      local_980[0] = local_970;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_980,"matrix","");
      local_960[0] = local_950;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_960,"min16float","");
      local_940[0] = local_930;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_940,"min10float","");
      local_920[0] = local_910;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"min16int","");
      local_900[0] = local_8f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_900,"min16uint","");
      local_8e0[0] = local_8d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8e0,"namespace","");
      local_8c0[0] = local_8b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"nointerpolation","");
      local_8a0[0] = local_890;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8a0,"noperspective","");
      local_880[0] = local_870;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_880,"NULL","");
      local_860[0] = local_850;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_860,"out","");
      local_840[0] = local_830;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"OutputPatch","");
      local_820[0] = local_810;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"payload","");
      local_800[0] = local_7f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"packoffset","");
      local_7e0[0] = local_7d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"pass","");
      local_7c0[0] = local_7b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7c0,"pixelfragment","");
      local_7a0[0] = local_790;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7a0,"PixelShader","");
      local_780[0] = local_770;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_780,"point","");
      local_760[0] = local_750;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_760,"PointStream","");
      local_740[0] = local_730;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"precise","");
      local_720[0] = local_710;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"RasterizerState","");
      local_700[0] = local_6f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"RenderTargetView","");
      local_6e0[0] = local_6d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"return","");
      local_6c0[0] = local_6b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"register","");
      local_6a0[0] = local_690;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"row_major","");
      local_680[0] = local_670;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"RWBuffer","");
      local_660[0] = local_650;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_660,"RWByteAddressBuffer","");
      local_640[0] = local_630;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"RWStructuredBuffer","")
      ;
      local_620[0] = local_610;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"RWTexture1D","");
      local_600[0] = local_5f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"RWTexture1DArray","");
      local_5e0[0] = local_5d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"RWTexture2D","");
      local_5c0[0] = local_5b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"RWTexture2DArray","");
      local_5a0[0] = local_590;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"RWTexture3D","");
      local_580[0] = local_570;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"sample","");
      local_560[0] = local_550;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"sampler","");
      local_540[0] = local_530;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"SamplerState","");
      local_520[0] = local_510;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_520,"SamplerComparisonState","");
      local_500[0] = local_4f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"shared","");
      local_4e0[0] = local_4d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"snorm","");
      local_4c0[0] = local_4b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"stateblock","");
      local_4a0[0] = local_490;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"stateblock_state","");
      local_480[0] = local_470;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"static","");
      local_460[0] = local_450;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"string","");
      local_440[0] = local_430;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"struct","");
      local_420[0] = local_410;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"switch","");
      local_400[0] = local_3f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"StructuredBuffer","");
      local_3e0[0] = local_3d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"tbuffer","");
      local_3c0[0] = local_3b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"technique","");
      local_3a0[0] = local_390;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"technique10","");
      local_380[0] = local_370;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"technique11","");
      local_360[0] = local_350;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"texture","");
      local_340[0] = local_330;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"Texture1D","");
      local_320[0] = local_310;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Texture1DArray","");
      local_300[0] = local_2f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"Texture2D","");
      local_2e0[0] = local_2d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"Texture2DArray","");
      local_2c0[0] = local_2b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"Texture2DMS","");
      local_2a0[0] = local_290;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"Texture2DMSArray","");
      local_280[0] = local_270;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"Texture3D","");
      local_260[0] = local_250;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"TextureCube","");
      local_240[0] = local_230;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"TextureCubeArray","");
      local_220[0] = local_210;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"true","");
      local_200[0] = local_1f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"typedef","");
      local_1e0[0] = local_1d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"triangle","");
      local_1c0[0] = local_1b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"triangleadj","");
      local_1a0[0] = local_190;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"TriangleStream","");
      local_180[0] = local_170;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"uint","");
      local_160[0] = local_150;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"uniform","");
      local_140[0] = local_130;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"unorm","");
      local_120[0] = local_110;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"unsigned","");
      local_100[0] = local_f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"vector","");
      local_e0[0] = local_d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"vertexfragment","");
      local_c0[0] = local_b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"VertexShader","");
      local_a0[0] = local_90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"vertices","");
      local_80[0] = local_70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"void","");
      local_60[0] = local_50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"volatile","");
      local_40[0] = local_30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"while","");
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&replace_illegal_names()::keywords_abi_cxx11_,local_fc0,&stack0xffffffffffffffe0
                 ,0,&local_fc1,&local_fc2,&local_fc3);
      lVar2 = 0;
      do {
        if (local_30 + lVar2 != *(undefined1 **)((long)local_40 + lVar2)) {
          operator_delete(*(undefined1 **)((long)local_40 + lVar2));
        }
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -4000);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&replace_illegal_names()::keywords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&replace_illegal_names()::keywords_abi_cxx11_);
    }
  }
  CompilerGLSL::replace_illegal_names
            (&this->super_CompilerGLSL,&replace_illegal_names()::keywords_abi_cxx11_);
  CompilerGLSL::replace_illegal_names(&this->super_CompilerGLSL);
  return;
}

Assistant:

void CompilerHLSL::replace_illegal_names()
{
	static const unordered_set<string> keywords = {
		// Additional HLSL specific keywords.
		// From https://docs.microsoft.com/en-US/windows/win32/direct3dhlsl/dx-graphics-hlsl-appendix-keywords
		"AppendStructuredBuffer", "asm", "asm_fragment",
		"BlendState", "bool", "break", "Buffer", "ByteAddressBuffer",
		"case", "cbuffer", "centroid", "class", "column_major", "compile",
		"compile_fragment", "CompileShader", "const", "continue", "ComputeShader",
		"ConsumeStructuredBuffer",
		"default", "DepthStencilState", "DepthStencilView", "discard", "do",
		"double", "DomainShader", "dword",
		"else", "export", "false", "float", "for", "fxgroup",
		"GeometryShader", "groupshared", "half", "HullShader",
		"indices", "if", "in", "inline", "inout", "InputPatch", "int", "interface",
		"line", "lineadj", "linear", "LineStream",
		"matrix", "min16float", "min10float", "min16int", "min16uint",
		"namespace", "nointerpolation", "noperspective", "NULL",
		"out", "OutputPatch",
		"payload", "packoffset", "pass", "pixelfragment", "PixelShader", "point",
		"PointStream", "precise", "RasterizerState", "RenderTargetView",
		"return", "register", "row_major", "RWBuffer", "RWByteAddressBuffer",
		"RWStructuredBuffer", "RWTexture1D", "RWTexture1DArray", "RWTexture2D",
		"RWTexture2DArray", "RWTexture3D", "sample", "sampler", "SamplerState",
		"SamplerComparisonState", "shared", "snorm", "stateblock", "stateblock_state",
		"static", "string", "struct", "switch", "StructuredBuffer", "tbuffer",
		"technique", "technique10", "technique11", "texture", "Texture1D",
		"Texture1DArray", "Texture2D", "Texture2DArray", "Texture2DMS", "Texture2DMSArray",
		"Texture3D", "TextureCube", "TextureCubeArray", "true", "typedef", "triangle",
		"triangleadj", "TriangleStream", "uint", "uniform", "unorm", "unsigned",
		"vector", "vertexfragment", "VertexShader", "vertices", "void", "volatile", "while",
	};

	CompilerGLSL::replace_illegal_names(keywords);
	CompilerGLSL::replace_illegal_names();
}